

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::GoogleTestFailureReporter::GoogleTestFailureReporter
          (GoogleTestFailureReporter *this)

{
  FailureReporterInterface *in_RDI;
  
  FailureReporterInterface::FailureReporterInterface(in_RDI);
  in_RDI->_vptr_FailureReporterInterface = (_func_int **)&PTR__GoogleTestFailureReporter_002abae0;
  return;
}

Assistant:

virtual void ReportFailure(FailureType type, const char* file, int line,
                             const string& message) {
    AssertHelper(type == kFatal ?
                 TestPartResult::kFatalFailure :
                 TestPartResult::kNonFatalFailure,
                 file,
                 line,
                 message.c_str()) = Message();
    if (type == kFatal) {
      posix::Abort();
    }
  }